

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O1

uint64_t helper_fmul8x16(uint64_t src1,uint64_t src2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = ((uint)src1 & 0xff) * (int)(short)src2;
  uVar1 = ((uint)(src1 >> 8) & 0xff) * ((int)src2 >> 0x10);
  uVar4 = ((uint)(src1 >> 0x10) & 0xff) * ((int)(src2 >> 0x10) >> 0x10);
  uVar2 = (int)((long)src2 >> 0x30) * ((uint)(src1 >> 0x18) & 0xff);
  return (ulong)(uVar3 + (uVar3 & 0x80) * 2 >> 8 & 0xffff) |
         (ulong)((uVar1 + (uVar1 & 0x80) * 2) * 0x100 & 0xffff0000) |
         (ulong)(uVar4 + (uVar4 & 0x80) * 2 >> 8 & 0xffff) << 0x20 |
         (ulong)(uVar2 + (uVar2 & 0x80) * 2 >> 8) << 0x30;
}

Assistant:

uint64_t helper_fmul8x16(uint64_t src1, uint64_t src2)
{
    VIS64 s, d;
    uint32_t tmp;

    s.ll = src1;
    d.ll = src2;

#define PMUL(r)                                                 \
    tmp = (int32_t)d.VIS_SW64(r) * (int32_t)s.VIS_B64(r);       \
    if ((tmp & 0xff) > 0x7f) {                                  \
        tmp += 0x100;                                           \
    }                                                           \
    d.VIS_W64(r) = tmp >> 8;

    PMUL(0);
    PMUL(1);
    PMUL(2);
    PMUL(3);
#undef PMUL

    return d.ll;
}